

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::View<short,_true,_std::allocator<unsigned_long>_>::testInvariant
          (View<short,_true,_std::allocator<unsigned_long>_> *this)

{
  long lVar1;
  runtime_error *this_00;
  long lVar2;
  size_t j;
  long lVar3;
  
  lVar1 = *(long *)(this + 0x28);
  if (lVar1 == 0) {
    if (this[0x3c] == (View<short,_true,_std::allocator<unsigned_long>_>)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
    else {
      if (*(long *)this == 0) {
        return;
      }
      if (*(long *)(this + 0x30) == 1) {
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
  }
  else if (*(long *)this == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    lVar2 = 1;
    lVar3 = 0;
    do {
      lVar2 = lVar2 * *(long *)(*(long *)(this + 0x10) + lVar3 * 8);
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
    if (*(long *)(this + 0x30) == lVar2) {
      lVar3 = 1;
      lVar2 = lVar1;
      if (*(int *)(this + 0x38) == 0) {
        do {
          if (*(long *)(*(long *)(this + 0x18) + -8 + lVar2 * 8) != lVar3) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_00218a2f;
          }
          lVar3 = lVar3 * *(long *)(*(long *)(this + 0x10) + -8 + lVar2 * 8);
          lVar2 = lVar2 + -1;
        } while (lVar2 != 0);
      }
      else {
        lVar2 = 0;
        do {
          if (*(long *)(*(long *)(this + 0x18) + lVar2 * 8) != lVar3) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_00218a2f;
          }
          lVar3 = lVar3 * *(long *)(*(long *)(this + 0x10) + lVar2 * 8);
          lVar2 = lVar2 + 1;
        } while (lVar1 != lVar2);
      }
      if (this[0x3c] == (View<short,_true,_std::allocator<unsigned_long>_>)0x1) {
        lVar2 = 0;
        do {
          if (*(long *)(*(long *)(this + 0x20) + lVar2 * 8) !=
              *(long *)(*(long *)(this + 0x18) + lVar2 * 8)) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_00218a2f;
          }
          lVar2 = lVar2 + 1;
        } while (lVar1 + (ulong)(lVar1 == 0) != lVar2);
      }
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
LAB_00218a2f:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline const std::size_t 
Geometry<A>::dimension() const
{
    return dimension_; 
}